

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O0

FunctionDefinitionPtr __thiscall Jinx::Impl::Runtime::FindFunction(Runtime *this,RuntimeID id)

{
  bool bVar1;
  pointer ppVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  FunctionDefinitionPtr FVar3;
  _Self local_48 [3];
  _Self local_30;
  const_iterator itr;
  lock_guard<std::mutex> lock;
  RuntimeID id_local;
  Runtime *this_local;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&itr,(mutex_type *)(id + 0x1090));
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>_>,_4096UL,_16UL>_>
       ::find((map<unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>_>,_4096UL,_16UL>_>
               *)(id + 0x10b8),(key_type_conflict *)&lock);
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>_>,_4096UL,_16UL>_>
       ::end((map<unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>_>,_4096UL,_16UL>_>
              *)(id + 0x10b8));
  bVar1 = std::operator==(&local_30,local_48);
  if (bVar1) {
    std::shared_ptr<Jinx::Impl::FunctionDefinition>::shared_ptr
              ((shared_ptr<Jinx::Impl::FunctionDefinition> *)this,(nullptr_t)0x0);
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>_>_>
             ::operator->(&local_30);
    std::shared_ptr<Jinx::Impl::FunctionDefinition>::shared_ptr
              ((shared_ptr<Jinx::Impl::FunctionDefinition> *)this,&ppVar2->second);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&itr);
  FVar3.super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  FVar3.super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (FunctionDefinitionPtr)
         FVar3.super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline_t FunctionDefinitionPtr Runtime::FindFunction(RuntimeID id) const
	{
		std::lock_guard<std::mutex> lock(m_functionMutex);
		auto itr = m_functionMap.find(id);
		if (itr == m_functionMap.end())
			return nullptr;
		return itr->second;
	}